

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_sm.c
# Opt level: O0

size_t apduCmdCDFLenLen(apdu_cmd_t *cmd)

{
  apdu_cmd_t *cmd_local;
  size_t local_8;
  
  if (cmd->cdf_len == 0) {
    local_8 = 0;
  }
  else if ((cmd->cdf_len < 0x100) && (cmd->rdf_len < 0x101)) {
    local_8 = 1;
  }
  else {
    local_8 = 3;
  }
  return local_8;
}

Assistant:

static size_t apduCmdCDFLenLen(const apdu_cmd_t* cmd)
{
	ASSERT(apduCmdIsValid(cmd));
	if (cmd->cdf_len == 0)
		return 0;
	if (cmd->cdf_len < 256 && cmd->rdf_len <= 256)
		return 1;
	return 3;
}